

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O1

string * __thiscall
GeneratorExpressionContent::ProcessArbitraryContent
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,const_iterator pit)

{
  pointer pvVar1;
  pointer puVar2;
  cmGeneratorExpressionEvaluator *pcVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  pointer puVar7;
  string *psVar8;
  string result;
  undefined1 local_d8 [40];
  value_type local_b0;
  string *local_90;
  GeneratorExpressionContent *local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pvVar1 = (this->ParamChildren).
           super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = __return_storage_ptr__;
  local_88 = this;
  local_80 = identifier;
  if (pvVar1 != pit._M_current) {
    while( true ) {
      local_78 = pvVar1;
      puVar2 = ((pit._M_current)->
               super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (puVar7 = ((pit._M_current)->
                    super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2;
          puVar7 = puVar7 + 1) {
        iVar4 = (*node->_vptr_cmGeneratorExpressionNode[3])(node);
        if (((char)iVar4 != '\0') &&
           (iVar4 = (*((puVar7->_M_t).
                       super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                       .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl)
                      ->_vptr_cmGeneratorExpressionEvaluator[2])(), iVar4 != 0)) {
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,local_88->StartContent,
                     local_88->StartContent + local_88->ContentLength);
          std::operator+(&local_50,"$<",local_80);
          psVar8 = local_90;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar6 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_70.field_2._M_allocated_capacity = *psVar6;
            local_70.field_2._8_8_ = plVar5[3];
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar6;
            local_70._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_70._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          reportError(context,(string *)local_d8,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
          psVar8->_M_string_length = 0;
          (psVar8->field_2)._M_local_buf[0] = '\0';
          goto LAB_0056f1f3;
        }
        pcVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl;
        (*pcVar3->_vptr_cmGeneratorExpressionEvaluator[3])(local_d8,pcVar3,context,dagChecker);
        std::__cxx11::string::_M_append((char *)&local_b0,local_d8._0_8_);
        if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        if (context->HadError == true) {
          (local_90->_M_dataplus)._M_p = (pointer)&local_90->field_2;
          local_90->_M_string_length = 0;
          (local_90->field_2)._M_local_buf[0] = '\0';
          psVar8 = local_90;
          goto LAB_0056f1f3;
        }
      }
      pit._M_current = pit._M_current + 1;
      if (pit._M_current == local_78) break;
      std::__cxx11::string::append((char *)&local_b0);
      pvVar1 = local_78;
    }
  }
  iVar4 = (*node->_vptr_cmGeneratorExpressionNode[3])(node);
  psVar8 = local_90;
  if ((char)iVar4 == '\0') {
    (local_90->_M_dataplus)._M_p = (pointer)&local_90->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      (local_90->field_2)._M_allocated_capacity =
           CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,local_b0.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&local_90->field_2 + 8) = local_b0.field_2._8_8_;
    }
    else {
      (local_90->_M_dataplus)._M_p = local_b0._M_dataplus._M_p;
      (local_90->field_2)._M_allocated_capacity =
           CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,local_b0.field_2._M_local_buf[0]);
    }
    local_90->_M_string_length = local_b0._M_string_length;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_d8._0_8_ = (pointer)0x0;
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8,&local_b0);
    (*node->_vptr_cmGeneratorExpressionNode[6])(psVar8,node,local_d8,context,local_88,dagChecker);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  }
LAB_0056f1f3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return psVar8;
}

Assistant:

std::string GeneratorExpressionContent::ProcessArbitraryContent(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<cmGeneratorExpressionEvaluatorVector>::const_iterator pit) const
{
  std::string result;

  const auto pend = this->ParamChildren.end();
  for (; pit != pend; ++pit) {
    for (const auto& pExprEval : *pit) {
      if (node->RequiresLiteralInput()) {
        if (pExprEval->GetType() != cmGeneratorExpressionEvaluator::Text) {
          reportError(context, this->GetOriginalExpression(),
                      "$<" + identifier +
                        "> expression requires literal input.");
          return std::string();
        }
      }
      result += pExprEval->Evaluate(context, dagChecker);
      if (context->HadError) {
        return std::string();
      }
    }
    if ((pit + 1) != pend) {
      result += ",";
    }
  }
  if (node->RequiresLiteralInput()) {
    std::vector<std::string> parameters;
    parameters.push_back(result);
    return node->Evaluate(parameters, context, this, dagChecker);
  }
  return result;
}